

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SpiAnalyzerResults::GenerateBubbleText
          (SpiAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  char cVar1;
  Frame frame;
  char number_str [128];
  Frame local_d0 [16];
  ulonglong local_c0;
  ulonglong local_b8;
  byte local_af;
  char local_a8 [128];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_d0);
  if ((local_af & 1) == 0) {
    cVar1 = Channel::operator==(channel,&this->mSettings->mMosiChannel);
    if (cVar1 == '\0') {
      AnalyzerHelpers::GetNumberString
                (local_b8,display_base,this->mSettings->mBitsPerTransfer,local_a8,0x80);
      AnalyzerResults::AddResultString
                ((char *)this,local_a8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerHelpers::GetNumberString
                (local_c0,display_base,this->mSettings->mBitsPerTransfer,local_a8,0x80);
      AnalyzerResults::AddResultString
                ((char *)this,local_a8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerResults::AddResultString
              ((char *)this,"Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Settings mismatch",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"The initial (idle) state of the CLK line does not match the settings.",
               (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_d0);
  return;
}

Assistant:

void SpiAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel,
                                             DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    if( ( frame.mFlags & SPI_ERROR_FLAG ) == 0 )
    {
        if( channel == mSettings->mMosiChannel )
        {
            char number_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerTransfer, number_str, 128 );
            AddResultString( number_str );
        }
        else
        {
            char number_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData2, display_base, mSettings->mBitsPerTransfer, number_str, 128 );
            AddResultString( number_str );
        }
    }
    else
    {
        AddResultString( "Error" );
        AddResultString( "Settings mismatch" );
        AddResultString( "The initial (idle) state of the CLK line does not match the settings." );
    }
}